

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O3

void __thiscall osc::OutboundPacketStream::EndElement(OutboundPacketStream *this,char *endPtr)

{
  uint *puVar1;
  uint32 *puVar2;
  uint uVar3;
  
  puVar1 = this->elementSizePtr_;
  if (puVar1 != (uint *)0x0) {
    if (puVar1 == (uint *)this->data_) {
      puVar2 = (uint32 *)0x0;
    }
    else {
      puVar2 = (uint32 *)((long)this->data_ + (ulong)*puVar1);
      uVar3 = ((int)endPtr - (int)puVar1) - 4;
      *puVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
    }
    this->elementSizePtr_ = puVar2;
    return;
  }
  __assert_fail("elementSizePtr_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/osc/OscOutboundPacketStream.cpp"
                ,0xca,"void osc::OutboundPacketStream::EndElement(char *)");
}

Assistant:

void OutboundPacketStream::EndElement( char *endPtr )
{
    assert( elementSizePtr_ != 0 );

    if( elementSizePtr_ == reinterpret_cast<uint32*>(data_) ){

        elementSizePtr_ = 0;

    }else{
        // while building an element, an offset to the containing element's
        // size slot is stored in the elements size slot (or a ptr to data_
        // if there is no containing element). We retrieve that here
        uint32 *previousElementSizePtr =
                reinterpret_cast<uint32*>(data_ + *elementSizePtr_);

        // then we store the element size in the slot. note that the element
        // size does not include the size slot, hence the - 4 below.

        std::ptrdiff_t d = endPtr - reinterpret_cast<char*>(elementSizePtr_);
        // assert( d >= 4 && d <= 0x7FFFFFFF ); // assume packets smaller than 2Gb

        uint32 elementSize = static_cast<uint32>(d - 4);
        FromUInt32( reinterpret_cast<char*>(elementSizePtr_), elementSize );

        // finally, we reset the element size ptr to the containing element
        elementSizePtr_ = previousElementSizePtr;
    }
}